

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O3

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  cmCPackLog *pcVar5;
  pointer pbVar6;
  _Alloc_hider msg;
  undefined8 uVar7;
  int iVar8;
  char *pcVar9;
  long *plVar10;
  size_t sVar11;
  ostream *poVar12;
  _Base_ptr p_Var13;
  _func_int **pp_Var14;
  size_type *psVar15;
  cmArchiveWrite archive;
  ostringstream cmCPackLog_msg_1;
  cmGeneratedFileStream gf;
  allocator local_471;
  string local_470;
  undefined1 local_450 [32];
  _Alloc_hider local_430;
  size_type local_428;
  undefined1 local_3f0 [16];
  _func_int *local_3e0 [12];
  ios_base local_380 [264];
  undefined1 local_278 [112];
  ios_base local_208 [472];
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->super_cmCPackGenerator).packageFileNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  pcVar3 = local_278 + 0x10;
  pcVar4 = (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
  local_278._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,pcVar4,
             pcVar4 + (this->super_cmCPackGenerator).toplevel._M_string_length);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
  if ((pointer)local_278._0_8_ != pcVar3) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  paVar2 = &local_470.field_2;
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"CPACK_PACKAGE_FILE_NAME","")
  ;
  pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_470);
  std::__cxx11::string::string((string *)local_450,pcVar9,&local_471);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_450,0,(char *)0x0,0x5411b2);
  pp_Var14 = (_func_int **)(plVar10 + 2);
  if ((_func_int **)*plVar10 == pp_Var14) {
    local_3e0[0] = *pp_Var14;
    local_3e0[1]._0_4_ = *(undefined4 *)(plVar10 + 3);
    local_3e0[1]._4_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
    local_3f0._0_8_ = local_3e0;
  }
  else {
    local_3e0[0] = *pp_Var14;
    local_3f0._0_8_ = (_func_int **)*plVar10;
  }
  local_3f0._8_8_ = plVar10[1];
  *plVar10 = (long)pp_Var14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[5])(this);
  plVar10 = (long *)std::__cxx11::string::append(local_3f0);
  psVar15 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar15) {
    local_278._16_8_ = *psVar15;
    local_278._24_8_ = plVar10[3];
    local_278._0_8_ = pcVar3;
  }
  else {
    local_278._16_8_ = *psVar15;
    local_278._0_8_ = (size_type *)*plVar10;
  }
  local_278._8_8_ = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)(this_00->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,local_278._0_8_);
  if ((pointer)local_278._0_8_ != pcVar3) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((_func_int **)local_3f0._0_8_ != local_3e0) {
    operator_delete((void *)local_3f0._0_8_,(ulong)(local_3e0[0] + 1));
  }
  if ((ostream *)local_450._0_8_ != (ostream *)(local_450 + 0x10)) {
    operator_delete((void *)local_450._0_8_,(ulong)((long)(uint *)local_450._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
             ,0x59);
  std::ios::widen((char)(ostringstream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_278);
  std::ostream::flush();
  pcVar5 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  uVar7 = local_3f0._0_8_;
  sVar11 = strlen((char *)local_3f0._0_8_);
  cmCPackLog::Log(pcVar5,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xec,(char *)uVar7,sVar11);
  if ((_func_int **)local_3f0._0_8_ != local_3e0) {
    operator_delete((void *)local_3f0._0_8_,(ulong)(local_3e0[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)local_278,
             (((this_00->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,false,true);
  iVar8 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[0x1c])(this,local_278);
  if (iVar8 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"Problem to generate Header for archive < ",0x29);
    pbVar6 = (this_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3f0,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,">.",2);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar5 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar7 = local_450._0_8_;
    sVar11 = strlen((char *)local_450._0_8_);
    cmCPackLog::Log(pcVar5,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xed,(char *)uVar7,sVar11);
    if ((ostream *)local_450._0_8_ != (ostream *)(local_450 + 0x10)) {
      operator_delete((void *)local_450._0_8_,(ulong)((long)(uint *)local_450._16_8_ + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
    std::ios_base::~ios_base(local_380);
    iVar8 = 0;
  }
  else {
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_450,(ostream *)local_278,this->Compress,&this->ArchiveFormat)
    ;
    if (local_428 == 0) {
      p_Var13 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      iVar8 = 1;
      if ((_Rb_tree_header *)p_Var13 != p_Var1) {
        do {
          addOneComponentToArchive
                    (this,(cmArchiveWrite *)local_450,(cmCPackComponent *)(p_Var13 + 2));
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
        } while ((_Rb_tree_header *)p_Var13 != p_Var1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f0,"Problem to create archive < ",0x1c);
      pbVar6 = (this_00->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f0,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,">. ERROR =",10);
      local_470._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_470,local_430._M_p,local_430._M_p + local_428);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_470._M_dataplus._M_p,local_470._M_string_length);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      msg._M_p = local_470._M_dataplus._M_p;
      sVar11 = strlen(local_470._M_dataplus._M_p);
      cmCPackLog::Log(pcVar5,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0xed,msg._M_p,sVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != paVar2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
      std::ios_base::~ios_base(local_380);
      iVar8 = 0;
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_450);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return iVar8;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  packageFileNames.clear();
  packageFileNames.push_back(std::string(toplevel));
  packageFileNames[0] += "/"
    +std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME"))
    + this->GetOutputExtension();
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
      << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0],archive);

  // The ALL COMPONENTS in ONE package case
  std::map<std::string, cmCPackComponent>::iterator compIt;
  for (compIt=this->Components.begin();compIt!=this->Components.end();
      ++compIt )
    {
    // Add the files of this component to the archive
    addOneComponentToArchive(archive,&(compIt->second));
    }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}